

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.pb.cc
# Opt level: O1

void __thiscall google::protobuf::Method::Clear(Method *this)

{
  ulong uVar1;
  anon_union_64_1_493b367e_for_Method_3 aVar2;
  undefined8 *puVar3;
  LogMessageFatal LStack_18;
  
  protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Option>>
            (&(this->field_0)._impl_.options_.super_RepeatedPtrFieldBase);
  aVar2 = this->field_0;
  if (((undefined1  [64])aVar2 & (undefined1  [64])0x7) != (undefined1  [64])0x0) {
    if (((undefined1  [64])aVar2 & (undefined1  [64])0x1) != (undefined1  [64])0x0) {
      uVar1 = *(ulong *)((long)&this->field_0 + 0x20);
      if ((uVar1 & 3) == 0) goto LAB_00eefb8f;
      puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
      puVar3[1] = 0;
      *(undefined1 *)*puVar3 = 0;
    }
    if (((undefined1  [64])aVar2 & (undefined1  [64])0x2) != (undefined1  [64])0x0) {
      uVar1 = *(ulong *)((long)&this->field_0 + 0x28);
      if ((uVar1 & 3) == 0) goto LAB_00eefb8f;
      puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
      puVar3[1] = 0;
      *(undefined1 *)*puVar3 = 0;
    }
    if (((undefined1  [64])aVar2 & (undefined1  [64])0x4) != (undefined1  [64])0x0) {
      uVar1 = *(ulong *)((long)&this->field_0 + 0x30);
      if ((uVar1 & 3) == 0) {
LAB_00eefb8f:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&LStack_18,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring.h"
                   ,0x20b,"!tagged_ptr_.IsDefault()");
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
      }
      puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
      puVar3[1] = 0;
      *(undefined1 *)*puVar3 = 0;
    }
  }
  if (((undefined1  [64])aVar2 & (undefined1  [64])0x38) != (undefined1  [64])0x0) {
    *(undefined8 *)((long)&this->field_0 + 0x38) = 0;
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void Method::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.Method)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.options_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.name_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _impl_.request_type_url_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _impl_.response_type_url_.ClearNonDefaultToEmpty();
    }
  }
  if ((cached_has_bits & 0x00000038u) != 0) {
    ::memset(&_impl_.request_streaming_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.syntax_) -
        reinterpret_cast<char*>(&_impl_.request_streaming_)) + sizeof(_impl_.syntax_));
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}